

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha256_ez(char *hash,char *data,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  char cVar5;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  byte bVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [14];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  ushort uVar32;
  undefined1 auVar33 [15];
  undefined1 auVar34 [14];
  ushort uVar35;
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  unkuint9 Var41;
  undefined1 auVar42 [11];
  undefined1 auVar43 [14];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  uint6 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  long lVar50;
  short sVar51;
  ushort uVar60;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  short sVar61;
  uint uVar62;
  uint uVar71;
  int iVar72;
  int iVar73;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar77;
  uint uVar83;
  int iVar84;
  undefined1 auVar78 [16];
  int iVar85;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  byte bVar99;
  byte bVar101;
  byte bVar103;
  byte bVar105;
  byte bVar107;
  byte bVar109;
  undefined1 auVar86 [11];
  undefined1 auVar89 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  uchar hval [32];
  sha256_ctx ctx;
  ulong local_98 [4];
  sha256_ctx local_78;
  char cVar4;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  undefined4 uVar52;
  undefined6 uVar53;
  undefined8 uVar54;
  undefined1 auVar55 [12];
  undefined1 auVar56 [14];
  undefined4 uVar63;
  undefined6 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined1 auVar70 [16];
  undefined1 auVar90 [16];
  undefined1 auVar87 [12];
  undefined1 auVar91 [16];
  undefined1 auVar88 [13];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar93 [16];
  char cVar100;
  char cVar102;
  char cVar104;
  char cVar106;
  char cVar108;
  char cVar110;
  byte bVar111;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  local_78.hash[0] = 0x6a09e667;
  local_78.hash[1] = 0xbb67ae85;
  local_78.hash[2] = 0x3c6ef372;
  local_78.hash[3] = 0xa54ff53a;
  local_78.hash[4] = 0x510e527f;
  local_78.hash[5] = 0x9b05688c;
  local_78.hash[6] = 0x1f83d9ab;
  local_78.hash[7] = 0x5be0cd19;
  sha256_hash((uchar *)data,len,&local_78);
  sha256_end((uchar *)local_98,&local_78);
  auVar49 = _DAT_002a2320;
  auVar48 = _DAT_002a2310;
  auVar47 = _DAT_002a22b0;
  lVar50 = 0;
  do {
    uVar2 = *(ulong *)((long)local_98 + lVar50);
    bVar111 = (byte)uVar2;
    bVar99 = (byte)(uVar2 >> 8);
    bVar101 = (byte)(uVar2 >> 0x10);
    bVar103 = (byte)(uVar2 >> 0x18);
    bVar105 = (byte)(uVar2 >> 0x20);
    bVar107 = (byte)(uVar2 >> 0x28);
    bVar109 = (byte)(uVar2 >> 0x30);
    bVar27 = (byte)(uVar2 >> 0x38);
    auVar95[0] = -((byte)((0x9f < bVar111) * -0x61 | (0x9f >= bVar111) * bVar111) == bVar111);
    cVar100 = -((byte)((0x9f < bVar99) * -0x61 | (0x9f >= bVar99) * bVar99) == bVar99);
    cVar102 = -((byte)((0x9f < bVar101) * -0x61 | (0x9f >= bVar101) * bVar101) == bVar101);
    cVar104 = -((byte)((0x9f < bVar103) * -0x61 | (0x9f >= bVar103) * bVar103) == bVar103);
    cVar106 = -((byte)((0x9f < bVar105) * -0x61 | (0x9f >= bVar105) * bVar105) == bVar105);
    cVar108 = -((byte)((0x9f < bVar107) * -0x61 | (0x9f >= bVar107) * bVar107) == bVar107);
    cVar110 = -((byte)((0x9f < bVar109) * -0x61 | (0x9f >= bVar109) * bVar109) == bVar109);
    bVar111 = -((byte)((0x9f < bVar27) * -0x61 | (0x9f >= bVar27) * bVar27) == bVar27);
    auVar89._0_9_ = CONCAT18(0xff,(ulong)bVar111 << 0x38);
    auVar86._0_10_ = CONCAT19(0xff,auVar89._0_9_);
    auVar86[10] = 0xff;
    auVar87[0xb] = 0xff;
    auVar87._0_11_ = auVar86;
    auVar88[0xc] = 0xff;
    auVar88._0_12_ = auVar87;
    auVar94[0xd] = 0xff;
    auVar94._0_13_ = auVar88;
    auVar28._8_6_ = 0;
    auVar28._0_8_ = uVar2;
    auVar28[0xe] = bVar27;
    auVar30._8_4_ = 0;
    auVar30._0_8_ = uVar2;
    auVar30[0xc] = bVar109;
    auVar30._13_2_ = auVar28._13_2_;
    auVar31._8_4_ = 0;
    auVar31._0_8_ = uVar2;
    auVar31._12_3_ = auVar30._12_3_;
    auVar33._8_2_ = 0;
    auVar33._0_8_ = uVar2;
    auVar33[10] = bVar107;
    auVar33._11_4_ = auVar31._11_4_;
    auVar36._8_2_ = 0;
    auVar36._0_8_ = uVar2;
    auVar36._10_5_ = auVar33._10_5_;
    auVar37[8] = bVar105;
    auVar37._0_8_ = uVar2;
    auVar37._9_6_ = auVar36._9_6_;
    auVar40._7_8_ = 0;
    auVar40._0_7_ = auVar37._8_7_;
    Var41 = CONCAT81(SUB158(auVar40 << 0x40,7),bVar103);
    auVar44._9_6_ = 0;
    auVar44._0_9_ = Var41;
    auVar42._1_10_ = SUB1510(auVar44 << 0x30,5);
    auVar42[0] = bVar101;
    auVar45._11_4_ = 0;
    auVar45._0_11_ = auVar42;
    auVar38[2] = bVar99;
    auVar38._0_2_ = (ushort)uVar2;
    auVar38._3_12_ = SUB1512(auVar45 << 0x20,3);
    auVar39._2_13_ = auVar38._2_13_;
    auVar39._0_2_ = (ushort)uVar2 & 0xff;
    uVar60 = (ushort)Var41;
    auVar29._10_2_ = 0;
    auVar29._0_10_ = auVar39._0_10_;
    auVar29._12_2_ = uVar60;
    uVar46 = CONCAT42(auVar29._10_4_,auVar42._0_2_);
    auVar43._6_8_ = 0;
    auVar43._0_6_ = uVar46;
    auVar34._4_2_ = auVar38._2_2_;
    auVar34._0_4_ = auVar39._0_4_;
    auVar34._6_8_ = SUB148(auVar43 << 0x40,6);
    auVar57._0_4_ = auVar39._0_4_ & 0xffff;
    auVar57._4_10_ = auVar34._4_10_;
    auVar57._14_2_ = 0;
    auVar113._2_2_ = 0;
    auVar113._0_2_ = auVar37._8_2_;
    auVar113._4_2_ = auVar33._10_2_;
    auVar113._6_2_ = 0;
    auVar113._8_2_ = auVar30._12_2_;
    auVar113._10_2_ = 0;
    auVar113[0xc] = bVar27;
    auVar113._13_3_ = 0;
    auVar97._0_4_ = CONCAT22(0,auVar37._8_2_ >> 4);
    uVar32 = auVar33._10_2_ >> 4;
    auVar97._4_2_ = uVar32;
    auVar97._6_2_ = 0;
    uVar35 = auVar30._12_2_ >> 4;
    auVar97._8_2_ = uVar35;
    auVar97._10_2_ = 0;
    bVar27 = bVar27 >> 4;
    auVar97[0xc] = bVar27;
    auVar97._13_3_ = 0;
    auVar112._0_4_ = auVar57._0_4_ >> 4;
    auVar112._4_4_ = auVar34._4_4_ >> 4;
    auVar112._8_4_ = (uint)uVar46 >> 4;
    uVar60 = uVar60 >> 4;
    auVar112._12_2_ = uVar60;
    auVar112._14_2_ = 0;
    auVar94[0xe] = bVar111;
    auVar94[0xf] = bVar111;
    auVar93._14_2_ = auVar94._14_2_;
    auVar93[0xd] = cVar110;
    auVar93._0_13_ = auVar88;
    auVar92._13_3_ = auVar93._13_3_;
    auVar92[0xc] = cVar110;
    auVar92._0_12_ = auVar87;
    auVar91._12_4_ = auVar92._12_4_;
    auVar91[0xb] = cVar108;
    auVar91._0_11_ = auVar86;
    auVar90._11_5_ = auVar91._11_5_;
    auVar90[10] = cVar108;
    auVar90._0_10_ = auVar86._0_10_;
    auVar89._10_6_ = auVar90._10_6_;
    auVar89[9] = cVar106;
    auVar95._8_8_ = (undefined8)(CONCAT72(auVar89._9_7_,CONCAT11(cVar106,bVar111)) >> 8);
    auVar95[7] = cVar104;
    auVar95[6] = cVar104;
    auVar95[5] = cVar102;
    auVar95[4] = cVar102;
    auVar95[3] = cVar100;
    auVar95[2] = cVar100;
    auVar95[1] = auVar95[0];
    auVar95 = auVar95 ^ _DAT_002a2350;
    auVar78._0_4_ = -(uint)((int)(auVar97._0_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar78._4_4_ = -(uint)((int)(uVar32 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar78._8_4_ = -(uint)((int)(uVar35 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar78._12_4_ = -(uint)((int)(bVar27 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._0_4_ = -(uint)((int)(auVar112._0_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._4_4_ = -(uint)((int)(auVar112._4_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._8_4_ = -(uint)((int)(auVar112._8_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar74._12_4_ = -(uint)((int)(uVar60 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar114._0_4_ = auVar112._0_4_ + 0x37;
    auVar114._4_4_ = auVar112._4_4_ + 0x37;
    auVar114._8_4_ = auVar112._8_4_ + 0x37;
    auVar114._12_4_ = uVar60 + 0x37;
    auVar115._0_4_ = auVar97._0_4_ + 0x37;
    auVar115._4_4_ = uVar32 + 0x37;
    auVar115._8_4_ = uVar35 + 0x37;
    auVar115._12_4_ = bVar27 + 0x37;
    auVar96._2_2_ = auVar95._8_2_;
    auVar96._0_2_ = auVar95._8_2_;
    auVar96._4_2_ = auVar95._10_2_;
    auVar96._6_2_ = auVar95._10_2_;
    auVar96._8_2_ = auVar95._12_2_;
    auVar96._10_2_ = auVar95._12_2_;
    auVar96._14_2_ = auVar95._14_2_;
    auVar96._12_2_ = auVar96._14_2_;
    auVar119._0_12_ = auVar95._0_12_;
    auVar119._12_2_ = auVar95._6_2_;
    auVar119._14_2_ = auVar95._6_2_;
    auVar118._12_4_ = auVar119._12_4_;
    auVar118._0_10_ = auVar95._0_10_;
    auVar118._10_2_ = auVar95._4_2_;
    auVar117._10_6_ = auVar118._10_6_;
    auVar117._0_8_ = auVar95._0_8_;
    auVar117._8_2_ = auVar95._4_2_;
    auVar116._8_8_ = auVar117._8_8_;
    auVar116._6_2_ = auVar95._2_2_;
    auVar116._4_2_ = auVar95._2_2_;
    auVar116._0_2_ = auVar95._0_2_;
    auVar116._2_2_ = auVar116._0_2_;
    auVar97 = ~auVar96 & (auVar97 | auVar49) | (~auVar78 & auVar48 | auVar115 & auVar78) & auVar96;
    auVar120 = ~auVar116 & (auVar112 | auVar49) |
               (~auVar74 & auVar48 | auVar114 & auVar74) & auVar116;
    auVar113 = auVar113 & _DAT_002a2330;
    auVar57 = auVar57 & _DAT_002a2330;
    uVar77 = auVar57._0_4_;
    uVar83 = auVar57._4_4_;
    iVar84 = auVar57._8_4_;
    iVar85 = auVar57._12_4_;
    uVar62 = auVar113._0_4_;
    uVar71 = auVar113._4_4_;
    iVar72 = auVar113._8_4_;
    iVar73 = auVar113._12_4_;
    auVar75._0_4_ = -(uint)((int)(uVar62 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar75._4_4_ = -(uint)((int)(uVar71 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar75._8_4_ = -(uint)((int)(iVar72 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar75._12_4_ = -(uint)((int)(iVar73 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar68._0_4_ = -(uint)((int)(uVar77 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar68._4_4_ = -(uint)((int)(uVar83 - 10 ^ 0x80000000) < -0x7ffffffa);
    auVar68._8_4_ = -(uint)((int)(iVar84 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar68._12_4_ = -(uint)((int)(iVar85 - 10U ^ 0x80000000) < -0x7ffffffa);
    auVar79._0_4_ = uVar77 + 0x37;
    auVar79._4_4_ = uVar83 + 0x37;
    auVar79._8_4_ = iVar84 + 0x37;
    auVar79._12_4_ = iVar85 + 0x37;
    auVar80._0_4_ = uVar62 + 0x37;
    auVar80._4_4_ = uVar71 + 0x37;
    auVar80._8_4_ = iVar72 + 0x37;
    auVar80._12_4_ = iVar73 + 0x37;
    auVar81._0_4_ = -(uint)(9 < uVar62);
    auVar81._4_4_ = -(uint)(9 < uVar71);
    auVar81._8_4_ = -(uint)(9 < iVar72);
    auVar81._12_4_ = -(uint)(9 < iVar73);
    auVar82 = ~auVar81 & (auVar113 | auVar49) | (~auVar75 & auVar48 | auVar80 & auVar75) & auVar81;
    auVar76._0_4_ = -(uint)(9 < uVar77);
    auVar76._4_4_ = -(uint)(9 < uVar83);
    auVar76._8_4_ = -(uint)(9 < iVar84);
    auVar76._12_4_ = -(uint)(9 < iVar85);
    auVar57 = ~auVar76 & (auVar57 | auVar49) | (~auVar68 & auVar48 | auVar79 & auVar68) & auVar76;
    auVar58._0_8_ = auVar120._0_8_;
    auVar58._8_4_ = auVar120._4_4_;
    auVar58._12_4_ = auVar57._4_4_;
    auVar59._8_8_ = auVar58._8_8_;
    auVar59._0_4_ = auVar120._0_4_;
    auVar59._4_4_ = auVar57._0_4_;
    auVar121._4_4_ = auVar57._8_4_;
    auVar121._0_4_ = auVar120._8_4_;
    auVar121._8_4_ = auVar120._12_4_;
    auVar121._12_4_ = auVar57._12_4_;
    auVar120._0_8_ = auVar97._0_8_;
    auVar120._8_4_ = auVar97._4_4_;
    auVar120._12_4_ = auVar82._4_4_;
    auVar69._8_8_ = auVar120._8_8_;
    auVar69._0_4_ = auVar97._0_4_;
    auVar69._4_4_ = auVar82._0_4_;
    auVar98._4_4_ = auVar82._8_4_;
    auVar98._0_4_ = auVar97._8_4_;
    auVar98._8_4_ = auVar97._12_4_;
    auVar98._12_4_ = auVar82._12_4_;
    auVar98 = auVar98 & auVar47;
    auVar69 = auVar69 & auVar47;
    sVar13 = auVar69._0_2_;
    cVar3 = (0 < sVar13) * (sVar13 < 0x100) * auVar69[0] - (0xff < sVar13);
    sVar13 = auVar69._2_2_;
    sVar61 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar69[2] - (0xff < sVar13),cVar3);
    sVar13 = auVar69._4_2_;
    cVar100 = (0 < sVar13) * (sVar13 < 0x100) * auVar69[4] - (0xff < sVar13);
    sVar13 = auVar69._6_2_;
    uVar63 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar69[6] - (0xff < sVar13),
                      CONCAT12(cVar100,sVar61));
    sVar13 = auVar69._8_2_;
    cVar102 = (0 < sVar13) * (sVar13 < 0x100) * auVar69[8] - (0xff < sVar13);
    sVar13 = auVar69._10_2_;
    uVar64 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar69[10] - (0xff < sVar13),
                      CONCAT14(cVar102,uVar63));
    sVar13 = auVar69._12_2_;
    cVar104 = (0 < sVar13) * (sVar13 < 0x100) * auVar69[0xc] - (0xff < sVar13);
    sVar13 = auVar69._14_2_;
    uVar65 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar69[0xe] - (0xff < sVar13),
                      CONCAT16(cVar104,uVar64));
    sVar13 = auVar98._0_2_;
    cVar106 = (0 < sVar13) * (sVar13 < 0x100) * auVar98[0] - (0xff < sVar13);
    sVar13 = auVar98._2_2_;
    auVar66._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar98[2] - (0xff < sVar13),
                  CONCAT18(cVar106,uVar65));
    sVar13 = auVar98._4_2_;
    cVar108 = (0 < sVar13) * (sVar13 < 0x100) * auVar98[4] - (0xff < sVar13);
    auVar66[10] = cVar108;
    sVar13 = auVar98._6_2_;
    auVar66[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar98[6] - (0xff < sVar13);
    sVar13 = auVar98._8_2_;
    cVar110 = (0 < sVar13) * (sVar13 < 0x100) * auVar98[8] - (0xff < sVar13);
    auVar67[0xc] = cVar110;
    auVar67._0_12_ = auVar66;
    sVar13 = auVar98._10_2_;
    auVar67[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar98[10] - (0xff < sVar13);
    sVar13 = auVar98._12_2_;
    cVar4 = (0 < sVar13) * (sVar13 < 0x100) * auVar98[0xc] - (0xff < sVar13);
    auVar70[0xe] = cVar4;
    auVar70._0_14_ = auVar67;
    sVar13 = auVar98._14_2_;
    auVar70[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar98[0xe] - (0xff < sVar13);
    auVar121 = auVar121 & auVar47;
    auVar59 = auVar59 & auVar47;
    sVar13 = auVar59._0_2_;
    cVar5 = (0 < sVar13) * (sVar13 < 0x100) * auVar59[0] - (0xff < sVar13);
    sVar13 = auVar59._2_2_;
    sVar51 = CONCAT11((0 < sVar13) * (sVar13 < 0x100) * auVar59[2] - (0xff < sVar13),cVar5);
    sVar13 = auVar59._4_2_;
    cVar6 = (0 < sVar13) * (sVar13 < 0x100) * auVar59[4] - (0xff < sVar13);
    sVar13 = auVar59._6_2_;
    uVar52 = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar59[6] - (0xff < sVar13),
                      CONCAT12(cVar6,sVar51));
    sVar13 = auVar59._8_2_;
    cVar7 = (0 < sVar13) * (sVar13 < 0x100) * auVar59[8] - (0xff < sVar13);
    sVar13 = auVar59._10_2_;
    uVar53 = CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar59[10] - (0xff < sVar13),
                      CONCAT14(cVar7,uVar52));
    sVar13 = auVar59._12_2_;
    cVar8 = (0 < sVar13) * (sVar13 < 0x100) * auVar59[0xc] - (0xff < sVar13);
    sVar13 = auVar59._14_2_;
    uVar54 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar59[0xe] - (0xff < sVar13),
                      CONCAT16(cVar8,uVar53));
    sVar13 = auVar121._0_2_;
    cVar9 = (0 < sVar13) * (sVar13 < 0x100) * auVar121[0] - (0xff < sVar13);
    sVar13 = auVar121._2_2_;
    auVar55._0_10_ =
         CONCAT19((0 < sVar13) * (sVar13 < 0x100) * auVar121[2] - (0xff < sVar13),
                  CONCAT18(cVar9,uVar54));
    sVar13 = auVar121._4_2_;
    cVar10 = (0 < sVar13) * (sVar13 < 0x100) * auVar121[4] - (0xff < sVar13);
    auVar55[10] = cVar10;
    sVar13 = auVar121._6_2_;
    auVar55[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar121[6] - (0xff < sVar13);
    sVar13 = auVar121._8_2_;
    cVar11 = (0 < sVar13) * (sVar13 < 0x100) * auVar121[8] - (0xff < sVar13);
    auVar56[0xc] = cVar11;
    auVar56._0_12_ = auVar55;
    sVar13 = auVar121._10_2_;
    auVar56[0xd] = (0 < sVar13) * (sVar13 < 0x100) * auVar121[10] - (0xff < sVar13);
    sVar13 = auVar121._12_2_;
    cVar12 = (0 < sVar13) * (sVar13 < 0x100) * auVar121[0xc] - (0xff < sVar13);
    auVar82[0xe] = cVar12;
    auVar82._0_14_ = auVar56;
    sVar13 = auVar121._14_2_;
    auVar82[0xf] = (0 < sVar13) * (sVar13 < 0x100) * auVar121[0xe] - (0xff < sVar13);
    sVar13 = (short)((uint)uVar52 >> 0x10);
    sVar14 = (short)((uint6)uVar53 >> 0x20);
    sVar15 = (short)((ulong)uVar54 >> 0x30);
    sVar16 = (short)((unkuint10)auVar55._0_10_ >> 0x40);
    sVar17 = auVar55._10_2_;
    sVar18 = auVar56._12_2_;
    sVar19 = auVar82._14_2_;
    sVar20 = (short)((uint)uVar63 >> 0x10);
    sVar21 = (short)((uint6)uVar64 >> 0x20);
    sVar22 = (short)((ulong)uVar65 >> 0x30);
    sVar23 = (short)((unkuint10)auVar66._0_10_ >> 0x40);
    sVar24 = auVar66._10_2_;
    sVar25 = auVar67._12_2_;
    sVar26 = auVar70._14_2_;
    pcVar1 = hash + lVar50 * 2;
    *pcVar1 = (0 < sVar51) * (sVar51 < 0x100) * cVar5 - (0xff < sVar51);
    pcVar1[1] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
    pcVar1[2] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
    pcVar1[3] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
    pcVar1[4] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
    pcVar1[5] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
    pcVar1[6] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
    pcVar1[7] = (0 < sVar19) * (sVar19 < 0x100) * cVar12 - (0xff < sVar19);
    pcVar1[8] = (0 < sVar61) * (sVar61 < 0x100) * cVar3 - (0xff < sVar61);
    pcVar1[9] = (0 < sVar20) * (sVar20 < 0x100) * cVar100 - (0xff < sVar20);
    pcVar1[10] = (0 < sVar21) * (sVar21 < 0x100) * cVar102 - (0xff < sVar21);
    pcVar1[0xb] = (0 < sVar22) * (sVar22 < 0x100) * cVar104 - (0xff < sVar22);
    pcVar1[0xc] = (0 < sVar23) * (sVar23 < 0x100) * cVar106 - (0xff < sVar23);
    pcVar1[0xd] = (0 < sVar24) * (sVar24 < 0x100) * cVar108 - (0xff < sVar24);
    pcVar1[0xe] = (0 < sVar25) * (sVar25 < 0x100) * cVar110 - (0xff < sVar25);
    pcVar1[0xf] = (0 < sVar26) * (sVar26 < 0x100) * cVar4 - (0xff < sVar26);
    lVar50 = lVar50 + 8;
  } while (lVar50 != 0x20);
  hash[0x40] = '\0';
  return;
}

Assistant:

void sha256_ez(char *hash, const char *data, size_t len)
{
    sha256_ctx ctx;
    const int HASH_BYTES = 32;
    unsigned char hval[HASH_BYTES];

    /* calculate the hash in binary format */
    sha256_begin(&ctx);
    sha256_hash((const unsigned char *)data, len, &ctx);
    sha256_end(hval, &ctx);

    /* convert the binary hash to printable hex digits */
    for (int i = 0 ; i < HASH_BYTES ; ++i, hash += 2)
        byte_to_xdigits(hash, hval[i]);

    /* null-terminate the string */
    *hash = '\0';
}